

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O0

bool __thiscall
wasm::DAE::removeReturnValue
          (DAE *this,Function *func,vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
          Module *module)

{
  iterator left;
  Module *this_00;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *this_01;
  bool bVar1;
  reference ppCVar2;
  pointer ppVar3;
  Expression *right;
  Block *pBVar4;
  optional<wasm::Type> type;
  bool local_a9;
  Type local_a8;
  BasicType local_a0 [2];
  optional<wasm::Type> local_98;
  Builder local_88;
  Builder builder;
  Expression **location;
  _Node_iterator_base<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false> local_70;
  iterator iter;
  Call *call;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range2;
  Type local_40;
  Type local_38;
  bool local_29;
  Module *pMStack_28;
  bool wasReturnUninhabitable;
  Module *module_local;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls_local;
  Function *func_local;
  DAE *this_local;
  
  pMStack_28 = module;
  module_local = (Module *)calls;
  calls_local = (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)func;
  func_local = (Function *)this;
  local_38 = Function::getResults(func);
  bVar1 = wasm::Type::isNull(&local_38);
  local_a9 = false;
  if (bVar1) {
    local_40 = Function::getResults((Function *)calls_local);
    local_a9 = wasm::Type::isNonNullable(&local_40);
  }
  this_01 = calls_local;
  local_29 = local_a9;
  wasm::Type::Type((Type *)&__range2,none);
  Function::setResults((Function *)this_01,(Type)__range2);
  this_00 = module_local;
  __end2 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::begin
                     ((vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)module_local);
  call = (Call *)std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end
                           ((vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                *)&call);
    if (!bVar1) {
      ReturnUtils::removeReturns((Function *)calls_local,pMStack_28);
      return (bool)(local_29 & 1);
    }
    ppCVar2 = __gnu_cxx::
              __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
              ::operator*(&__end2);
    iter.super__Node_iterator_base<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false>._M_cur
         = (_Node_iterator_base<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false>)*ppCVar2;
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Call_*,_wasm::Expression_**,_std::hash<wasm::Call_*>,_std::equal_to<wasm::Call_*>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>_>
         ::find(&this->allDroppedCalls,(key_type *)&iter);
    location = (Expression **)
               std::
               unordered_map<wasm::Call_*,_wasm::Expression_**,_std::hash<wasm::Call_*>,_std::equal_to<wasm::Call_*>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>_>
               ::end(&this->allDroppedCalls);
    bVar1 = std::__detail::operator!=
                      (&local_70,
                       (_Node_iterator_base<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false>
                        *)&location);
    if (!bVar1) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false,_false>::
             operator->((_Node_iterator<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false,_false>
                         *)&local_70);
    builder.wasm = (Module *)ppVar3->second;
    if ((local_29 & 1U) == 0) {
      ((builder.wasm)->exports).
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)iter.
                    super__Node_iterator_base<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false>
                    ._M_cur;
    }
    else {
      Builder::Builder(&local_88,pMStack_28);
      left = iter;
      right = (Expression *)Builder::makeUnreachable(&local_88);
      std::optional<wasm::Type>::optional(&local_98);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_98.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_98.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      pBVar4 = Builder::makeSequence
                         (&local_88,
                          (Expression *)
                          left.
                          super__Node_iterator_base<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false>
                          ._M_cur,right,type);
      ((builder.wasm)->exports).
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar4;
    }
    local_a0[0] = unreachable;
    bVar1 = wasm::Type::operator!=
                      ((Type *)((long)iter.
                                      super__Node_iterator_base<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false>
                                      ._M_cur + 8),local_a0);
    if (bVar1) {
      wasm::Type::Type(&local_a8,none);
      *(uintptr_t *)
       ((long)iter.
              super__Node_iterator_base<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false>.
              _M_cur + 8) = local_a8.id;
    }
    __gnu_cxx::
    __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>::
    operator++(&__end2);
  }
  __assert_fail("iter != allDroppedCalls.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeadArgumentElimination.cpp"
                ,0x1b8,
                "bool wasm::DAE::removeReturnValue(Function *, std::vector<Call *> &, Module *)");
}

Assistant:

bool
  removeReturnValue(Function* func, std::vector<Call*>& calls, Module* module) {
    // If the result type is uninhabitable, then the caller knows the call will
    // never return. That useful information would be lost if we did nothing
    // else when removing the return value, but we will insert an `unreachable`
    // after the call in the caller to preserve the optimization effect. TODO:
    // Do this for more complicated uninhabitable types such as non-nullable
    // references to structs with non-nullable reference cycles.
    bool wasReturnUninhabitable =
      func->getResults().isNull() && func->getResults().isNonNullable();
    func->setResults(Type::none);
    // Remove the drops on the calls. Note that we must do this before updating
    // returns in ReturnUpdater, as there may be recursive calls of this
    // function to itself. So we first use the information in allDroppedCalls
    // before the ReturnUpdater potentially invalidates that information as it
    // modifies the function.
    for (auto* call : calls) {
      auto iter = allDroppedCalls.find(call);
      assert(iter != allDroppedCalls.end());
      Expression** location = iter->second;
      if (wasReturnUninhabitable) {
        Builder builder(*module);
        *location = builder.makeSequence(call, builder.makeUnreachable());
      } else {
        *location = call;
      }
      // Update the call's type.
      if (call->type != Type::unreachable) {
        call->type = Type::none;
      }
    }
    // Remove any return values.
    ReturnUtils::removeReturns(func, *module);
    // It's definitely worth optimizing the caller after inserting the
    // unreachable.
    return wasReturnUninhabitable;
  }